

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

uoffset_t __thiscall flatbuffers::Parser::ParseVector(Parser *this,Type *type)

{
  double element;
  char element_00;
  uchar uVar1;
  short element_01;
  unsigned_short element_02;
  int element_03;
  uint element_04;
  Offset<void> OVar2;
  uoffset_t uVar3;
  size_t sVar4;
  size_t elemsize;
  reference val_00;
  long element_05;
  unsigned_long element_06;
  char *pcVar5;
  bool bVar6;
  float element_07;
  Value *val_1;
  int i;
  pair<flatbuffers::Value,_std::nullptr_t> local_108;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> local_c0;
  undefined1 auStack_68 [8];
  Value val;
  int local_1c;
  int count;
  Type *type_local;
  Parser *this_local;
  
  local_1c = 0;
  bVar6 = this->token_ != 0x5d;
  while (bVar6) {
    Value::Value((Value *)auStack_68);
    val.type.struct_def = (StructDef *)type->enum_def;
    auStack_68._0_4_ = type->base_type;
    auStack_68._4_4_ = type->element;
    val.type._0_8_ = type->struct_def;
    ParseAnyValue(this,(Value *)auStack_68,(FieldDef *)0x0);
    _i = (void *)0x0;
    std::make_pair<flatbuffers::Value&,decltype(nullptr)>
              (&local_108,(Value *)auStack_68,(void **)&i);
    std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>::
    pair<flatbuffers::Value,_std::nullptr_t,_true>(&local_c0,&local_108);
    std::
    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
    ::push_back(&this->field_stack_,&local_c0);
    std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>::~pair(&local_c0);
    std::pair<flatbuffers::Value,_std::nullptr_t>::~pair(&local_108);
    local_1c = local_1c + 1;
    bVar6 = this->token_ != 0x5d;
    if (bVar6) {
      Expect(this,0x2c);
    }
    Value::~Value((Value *)auStack_68);
  }
  Next(this);
  sVar4 = InlineSize(type);
  elemsize = InlineAlignment(type);
  FlatBufferBuilder::StartVector(&this->builder_,(long)local_1c * sVar4,elemsize);
  for (val_1._0_4_ = 0; (int)val_1 < local_1c; val_1._0_4_ = (int)val_1 + 1) {
    val_00 = std::
             vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
             ::back(&this->field_stack_);
    switch((val_00->first).type.base_type) {
    case BASE_TYPE_NONE:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        uVar1 = atot<unsigned_char>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_char>(&this->builder_,uVar1);
      }
      break;
    case BASE_TYPE_UTYPE:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        uVar1 = atot<unsigned_char>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_char>(&this->builder_,uVar1);
      }
      break;
    case BASE_TYPE_BOOL:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        uVar1 = atot<unsigned_char>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_char>(&this->builder_,uVar1);
      }
      break;
    case BASE_TYPE_CHAR:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_00 = atot<signed_char>(pcVar5);
        FlatBufferBuilder::PushElement<signed_char>(&this->builder_,element_00);
      }
      break;
    case BASE_TYPE_UCHAR:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        uVar1 = atot<unsigned_char>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_char>(&this->builder_,uVar1);
      }
      break;
    case BASE_TYPE_SHORT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_01 = atot<short>(pcVar5);
        FlatBufferBuilder::PushElement<short>(&this->builder_,element_01);
      }
      break;
    case BASE_TYPE_USHORT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_02 = atot<unsigned_short>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_short>(&this->builder_,element_02);
      }
      break;
    case BASE_TYPE_INT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_03 = atot<int>(pcVar5);
        FlatBufferBuilder::PushElement<int>(&this->builder_,element_03);
      }
      break;
    case BASE_TYPE_UINT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_04 = atot<unsigned_int>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_int>(&this->builder_,element_04);
      }
      break;
    case BASE_TYPE_LONG:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_05 = atot<long>(pcVar5);
        FlatBufferBuilder::PushElement<long>(&this->builder_,element_05);
      }
      break;
    case BASE_TYPE_ULONG:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_06 = atot<unsigned_long>(pcVar5);
        FlatBufferBuilder::PushElement<unsigned_long>(&this->builder_,element_06);
      }
      break;
    case BASE_TYPE_FLOAT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element_07 = atot<float>(pcVar5);
        FlatBufferBuilder::PushElement<float>(&this->builder_,element_07);
      }
      break;
    case BASE_TYPE_DOUBLE:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        element = atot<double>(pcVar5);
        FlatBufferBuilder::PushElement<double>(&this->builder_,element);
      }
      break;
    case BASE_TYPE_STRING:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        OVar2 = atot<flatbuffers::Offset<void>>(pcVar5);
        FlatBufferBuilder::PushElement<void>(&this->builder_,OVar2);
      }
      break;
    case BASE_TYPE_VECTOR:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        OVar2 = atot<flatbuffers::Offset<void>>(pcVar5);
        FlatBufferBuilder::PushElement<void>(&this->builder_,OVar2);
      }
      break;
    case BASE_TYPE_STRUCT:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        OVar2 = atot<flatbuffers::Offset<void>>(pcVar5);
        FlatBufferBuilder::PushElement<void>(&this->builder_,OVar2);
      }
      break;
    case BASE_TYPE_UNION:
      bVar6 = IsStruct((Type *)val_00);
      if (bVar6) {
        SerializeStruct(this,(val_00->first).type.struct_def,&val_00->first);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        OVar2 = atot<flatbuffers::Offset<void>>(pcVar5);
        FlatBufferBuilder::PushElement<void>(&this->builder_,OVar2);
      }
    }
    std::
    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
    ::pop_back(&this->field_stack_);
  }
  FlatBufferBuilder::ClearOffsets(&this->builder_);
  uVar3 = FlatBufferBuilder::EndVector(&this->builder_,(long)local_1c);
  return uVar3;
}

Assistant:

uoffset_t Parser::ParseVector(const Type &type) {
  int count = 0;
  if (token_ != ']') for (;;) {
    Value val;
    val.type = type;
    ParseAnyValue(val, NULL);
    field_stack_.push_back(std::make_pair(val, nullptr));
    count++;
    if (token_ == ']') break;
    Expect(',');
  }
  Next();

  builder_.StartVector(count * InlineSize(type), InlineAlignment((type)));
  for (int i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else builder_.PushElement(atot<CTYPE>(val.constant.c_str())); \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  return builder_.EndVector(count);
}